

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall
pobr::main::App::App
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer *this_00;
  initializer_list<unsigned_char> list;
  initializer_list<unsigned_char> list_00;
  bool bVar1;
  long lVar2;
  Mat *segments;
  Exception *e;
  undefined4 local_2e8;
  uchar local_2e3 [3];
  iterator local_2e0;
  undefined8 local_2d8;
  Vec<unsigned_char,_3> local_2cb;
  undefined1 local_2c8 [8];
  Mat img_1;
  _InputArray local_268;
  undefined4 local_250;
  uchar local_24b [3];
  iterator local_248;
  undefined8 local_240;
  Vec<unsigned_char,_3> local_233;
  ImgProcessor local_230;
  undefined1 local_1d0 [8];
  Mat img;
  undefined1 local_170 [8];
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  letterSegments;
  ImgProcessor imgProcessor;
  bool local_ea;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  byte local_9a;
  allocator local_99;
  undefined1 local_98 [6];
  bool showBinaryImg;
  undefined1 local_78 [8];
  string filepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_30 [8];
  CmdParser cmdParser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  App *this_local;
  
  cmdParser.arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)arguments;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,arguments);
  utils::CmdParser::CmdParser((CmdParser *)local_30,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,"file",&local_99);
  utils::CmdParser::getFlagValue((string *)local_78,(CmdParser *)local_30,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"binary",&local_c1);
  bVar1 = utils::CmdParser::hasFlag((CmdParser *)local_30,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_9a = bVar1;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"No input file specified",&local_e9);
    local_ea = false;
    utils::Logger::error(&local_e8,&local_ea);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  letterSegments.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &letterSegments.
             super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  imgProcessing::ImgProcessor::ImgProcessor((ImgProcessor *)this_00);
  imgProcessing::ImgProcessor::loadImg((ImgProcessor *)this_00,(string *)local_78);
  imgProcessing::ImgProcessor::process
            ((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              *)local_170,
             (ImgProcessor *)
             &letterSegments.
              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((local_9a & 1) == 0) {
    segments = imgProcessing::ImgProcessor::getImg
                         ((ImgProcessor *)
                          &letterSegments.
                           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2e3[0] = '\0';
    local_2e3[1] = 0;
    local_2e3[2] = 0;
    local_2e0 = local_2e3;
    local_2d8 = 3;
    list._M_len = 3;
    list._M_array = local_2e0;
    cv::Vec<unsigned_char,_3>::Vec(&local_2cb,list);
    local_2e8 = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)local_2c8,
               (Mat *)&letterSegments.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)segments,(Vec3b *)local_170,(uint *)&local_2cb);
    cv::_InputArray::_InputArray((_InputArray *)&e,(Mat *)local_2c8);
    cv::imshow((string *)local_78,(_InputArray *)&e);
    cv::_InputArray::~_InputArray((_InputArray *)&e);
    cv::Mat::~Mat((Mat *)local_2c8);
  }
  else {
    imgProcessing::ImgProcessor::getBinarizedImg(&local_230);
    local_24b[0] = '\0';
    local_24b[1] = 0;
    local_24b[2] = 0xff;
    local_248 = local_24b;
    local_240 = 3;
    list_00._M_len = 3;
    list_00._M_array = local_248;
    cv::Vec<unsigned_char,_3>::Vec(&local_233,list_00);
    local_250 = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)local_1d0,
               (Mat *)&letterSegments.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)&local_230,(Vec3b *)local_170,(uint *)&local_233);
    cv::Mat::~Mat(&local_230.img);
    cv::_InputArray::_InputArray(&local_268,(Mat *)local_1d0);
    cv::imshow((string *)local_78,&local_268);
    cv::_InputArray::~_InputArray(&local_268);
    cv::Mat::~Mat((Mat *)local_1d0);
  }
  cv::waitKey(-1);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *)local_170);
  imgProcessing::ImgProcessor::~ImgProcessor
            ((ImgProcessor *)
             &letterSegments.
              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_78);
  utils::CmdParser::~CmdParser((CmdParser *)local_30);
  return;
}

Assistant:

App::App(const std::vector<std::string>& arguments)
{
    try
    {
        auto cmdParser = CmdParser(arguments);

        auto const filepath = cmdParser.getFlagValue("file");
        const bool showBinaryImg = cmdParser.hasFlag("binary");

        if (filepath.length() < 1)
        {
            Logger::error("No input file specified");
        }

        auto imgProcessor = ImgProcessor();

        imgProcessor.loadImg(filepath);

        auto letterSegments = imgProcessor.process();

        if (showBinaryImg) {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getBinarizedImg(),
                letterSegments,
                { 0, 0, 255 },
                3
            );

            cv::imshow(filepath, img);
        } else {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getImg(),
                letterSegments,
                { 0, 0, 0 },
                3
            );

            cv::imshow(filepath, img);
        }

        cv::waitKey(-1);

    }
    catch(Logger::Exception &e)
    {
        Logger::error("Terminating...", true);
    }
}